

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_ffh_assert(lua_State *L)

{
  GCstr *pGVar1;
  char *in_RDI;
  lua_State *unaff_retaddr;
  GCstr *s;
  ErrMsg in_stack_ffffffffffffffec;
  lua_State *in_stack_fffffffffffffff0;
  
  lj_lib_checkany(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  pGVar1 = lj_lib_optstr(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  if (pGVar1 != (GCstr *)0x0) {
    lj_err_callermsg(unaff_retaddr,in_RDI);
  }
  lj_err_caller((lua_State *)0x0,in_stack_ffffffffffffffec);
}

Assistant:

LJLIB_ASM(assert)		LJLIB_REC(.)
{
  GCstr *s;
  lj_lib_checkany(L, 1);
  s = lj_lib_optstr(L, 2);
  if (s)
    lj_err_callermsg(L, strdata(s));
  else
    lj_err_caller(L, LJ_ERR_ASSERT);
  return FFH_UNREACHABLE;
}